

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O0

EC_T_CHAR * SlaveVendorText(T_eEtherCAT_Vendor EV)

{
  char *local_18;
  EC_T_CHAR *pRet;
  T_eEtherCAT_Vendor EV_local;
  
  if (EV == ecvendor_handtmann) {
    local_18 = "Albert Handtmann Maschinenfabrik GmbH & Co. KG";
  }
  else if (EV == ecvendor_kollmorgen) {
    local_18 = "Kollmorgen Corporation";
  }
  else if (EV == ecvendor_parker) {
    local_18 = "Parker?";
  }
  else if (EV == ecvendor_etg) {
    local_18 = "EtherCAT Technology Group";
  }
  else if (EV == ecvendor_beckhoff) {
    local_18 = "Beckhoff Automation GmbH";
  }
  else if (EV == ecvendor_scuola_superiore_s_anna) {
    local_18 = "Scuola Superiore S. Anna (PERCRO)";
  }
  else if (EV == ecvendor_ixxat) {
    local_18 = "IXXAT Automation GmbH";
  }
  else if (EV == ecvendor_vector_informatik) {
    local_18 = "Vector Informatik GmbH";
  }
  else if (EV == ecvendor_knestel) {
    local_18 = "KNESTEL Technologie & Elektronik GmbH (Hardware/Product Development)";
  }
  else if (EV == ecvendor_cmz_sistemi) {
    local_18 = "CMZ Sistemi Elettronici";
  }
  else if (EV == ecvendor_softing) {
    local_18 = "Softing AG";
  }
  else if (EV == ecvendor_microcontrol) {
    local_18 = "MicroControl GmbH & Co. KG";
  }
  else if (EV == ecvendor_pollmeier) {
    local_18 = "ESR Pollmeier";
  }
  else if (EV == ecvendor_lust) {
    local_18 = "LTI Lust";
  }
  else if (EV == ecvendor_kuebler) {
    local_18 = "Fritz Kuebler GmbH";
  }
  else if (EV == ecvendor_keb) {
    local_18 = "KEB, Karl E. Brinkmann GmbH";
  }
  else if (EV == ecvendor_lti) {
    local_18 = "LTi DRiVES GmbH";
  }
  else if (EV == ecvendor_esd_electronic_design) {
    local_18 = "esd electronic system design gmbh";
  }
  else if (EV == ecvendor_hms_industrial_networks) {
    local_18 = "HMS Industrial Networks AB";
  }
  else if (EV == ecvendor_epis_automation) {
    local_18 = "epis Automation GmbH & Co. KG";
  }
  else if (EV == ecvendor_festo) {
    local_18 = "Festo AG & Co, KG (TV-N)";
  }
  else if (EV == ecvendor_wago) {
    local_18 = "WAGO Kontakttechnik GmbH & Co. KG";
  }
  else if (EV == ecvendor_boschrexroth) {
    local_18 = "Bosch Rexroth AG";
  }
  else if (EV == ecvendor_moog) {
    local_18 = "Moog GmbH";
  }
  else if (EV == ecvendor_port) {
    local_18 = "port GmbH";
  }
  else if (EV == ecvendor_buerkert_werke) {
    local_18 = "Buerkert Werke GmbH & Co. KG (Development)";
  }
  else if (EV == ecvendor_lenze) {
    local_18 = "Lenze Drive Systems GmbH (Lenze AG)";
  }
  else if (EV == ecvendor_tigris_electronic) {
    local_18 = "Tigris Electronic GmbH";
  }
  else if (EV == ecvendor_hilscher) {
    local_18 = "Hilscher GmbH";
  }
  else if (EV == ecvendor_murrelektronik) {
    local_18 = "Murrelektronik GmbH";
  }
  else if (EV == ecvendor_bombardier_transportation) {
    local_18 = "Bombardier Transportation (Power Converter Solutions) Germany GmbH (PCS Germany)";
  }
  else if (EV == ecvendor_komax) {
    local_18 = "Komax AG";
  }
  else if (EV == ecvendor_sew_eurodrive) {
    local_18 = "SEW-EURODRIVE GmbH & Co. (EETB)";
  }
  else if (EV == ecvendor_bachmann_electronic) {
    local_18 = "Bachmann electronic GmbH";
  }
  else if (EV == ecvendor_danaher) {
    local_18 = "Danaher Motion GmbH";
  }
  else if (EV == ecvendor_woodward_seg) {
    local_18 = "Woodward SEG GmbH & Co. KG";
  }
  else if (EV == ecvendor_bernecker_rainer_ie) {
    local_18 = "Bernecker + Rainer Industrie-Elektronik Ges.m.b.H";
  }
  else if (EV == ecvendor_infranor_electronics) {
    local_18 = "Infranor Electronics Sas";
  }
  else if (EV == ecvendor_omron) {
    local_18 = "OMRON Corporation";
  }
  else if (EV == ecvendor_gefran) {
    local_18 = "Gefran S.P.A.";
  }
  else if (EV == ecvendor_elmo_motion) {
    local_18 = "Elmo Motion Control Ltd.";
  }
  else if (EV == ecvendor_sontheim_industrie_elektronik) {
    local_18 = "Sontheim Industrie Elektronik GmbH";
  }
  else if (EV == ecvendor_hirschmann_automation) {
    local_18 = "Hirschmann Automation and Control GmbH (INET)";
  }
  else if (EV == ecvendor_copley) {
    local_18 = "Copley Controls, a Division of Analogic Corporation";
  }
  else if (EV == ecvendor_pepperl_fuchs) {
    local_18 = "Pepperl+Fuchs GmbH";
  }
  else if (EV == ecvendor_johannes_huebner) {
    local_18 = "Johannes Huebner Fabrik elektrischer Maschinen GmbH";
  }
  else if (EV == ecvendor_abb_oy_drives) {
    local_18 = "ABB Oy Drives";
  }
  else if (EV == ecvendor_stoeber) {
    local_18 = "Stoeber Antriebstechnik GmbH & Co. KG";
  }
  else if (EV == ecvendor_messung_systems) {
    local_18 = "MESSUNG SYSTEMS";
  }
  else if (EV == ecvendor_bonfiglioli_vectron) {
    local_18 = "BONFIGLIOLI VECTRON GmbH";
  }
  else if (EV == ecvendor_phase_motion_control) {
    local_18 = "Phase Motion Control SpA";
  }
  else if (EV == ecvendor_metronix) {
    local_18 = "Metronix Messgeraete und Elektronik GmbH";
  }
  else if (EV == ecvendor_ascon) {
    local_18 = "Ascon S.p.A. (R&D)";
  }
  else if (EV == ecvendor_controltechniques) {
    local_18 = "Control Techniques";
  }
  else if (EV == ecvendor_maxon_motor) {
    local_18 = "Maxon motor";
  }
  else if (EV == ecvendor_keba) {
    local_18 = "KEBA AG (Product Development - Control)";
  }
  else if (EV == ecvendor_wittenstein) {
    local_18 = "WITTENSTEIN motion control GmbH";
  }
  else if (EV == ecvendor_twk_elektronik) {
    local_18 = "TWK-Elektronik GmbH";
  }
  else if (EV == ecvendor_psa_elettronica) {
    local_18 = "PSA Elettronica di F. Grifa";
  }
  else if (EV == ecvendor_smc) {
    local_18 = "SMC Corporation";
  }
  else if (EV == ecvendor_jvl_industri_elektronik) {
    local_18 = "JVL Industri Elektronik A/S";
  }
  else if (EV == ecvendor_hottinger_baldwin) {
    local_18 = "Hottinger Baldwin Messtechnik GmbH";
  }
  else if (EV == ecvendor_leuze_electronic) {
    local_18 = "Leuze electronic GmbH + Co. KG";
  }
  else if (EV == ecvendor_jumo) {
    local_18 = "Juchheim Fulda";
  }
  else if (EV == ecvendor_hsd) {
    local_18 = "HSD S.p.A";
  }
  else if (EV == ecvendor_lika_electronic) {
    local_18 = "Lika Electronic SncCSM GmbH";
  }
  else if (EV == ecvendor_csm) {
    local_18 = "CSM GmbH";
  }
  else if (EV == ecvendor_lpkf_motion_control) {
    local_18 = "LPKF Motion & Control GmbH";
  }
  else if (EV == ecvendor_imc_messysteme) {
    local_18 = "imc Messysteme GmbH";
  }
  else if (EV == ecvendor_baumueller) {
    local_18 = "Baumueller Nuernberg GmbH";
  }
  else if (EV == ecvendor_pneumax) {
    local_18 = "Pneumax S.p.A.";
  }
  else if (EV == ecvendor_promess) {
    local_18 = "Promess Incorporated";
  }
  else if (EV == ecvendor_deutschmann) {
    local_18 = "Deutschmann Automation GmbH & Co. KG";
  }
  else if (EV == ecvendor_golden) {
    local_18 = "Golden A/S (Research And Development)";
  }
  else if (EV == ecvendor_brunner_elektronik) {
    local_18 = "Brunner Elektronik AG";
  }
  else if (EV == ecvendor_technosoft) {
    local_18 = "TECHNOSOFT S.A.";
  }
  else if (EV == ecvendor_peyer_engineering) {
    local_18 = "Peyer Engineering";
  }
  else if (EV == ecvendor_robox) {
    local_18 = "Robox S.P.A.";
  }
  else if (EV == ecvendor_sanyo_denki) {
    local_18 = "Sanyo Denki Co., Ltd. (2nd Design Dept. Servo System Div.)";
  }
  else if (EV == ecvendor_delta_electronics) {
    local_18 = "Delta Electronics, Inc.";
  }
  else if (EV == ecvendor_amk) {
    local_18 = "AMK GmbH & Co. KG";
  }
  else if (EV == ecvendor_national_instruments) {
    local_18 = "National Instruments (PortableDAQ)";
  }
  else if (EV == ecvendor_fernsteuergeraete_kurt_oelsch) {
    local_18 = "Fernsteuergeraete Kurt Oelsch GmbH";
  }
  else if (EV == ecvendor_idam) {
    local_18 = "INA - Drives & Mechatronics GmbH & Co.oHG (Research & Development)";
  }
  else if (EV == ecvendor_prueftechnik_ndt) {
    local_18 = "PRUEFTECHNIK NDT GmbH";
  }
  else if (EV == ecvendor_baumer_th) {
    local_18 = "Baumer Thalheim?";
  }
  else if (EV == ecvendor_esitron_electronic) {
    local_18 = "esitron-electronic GmbH";
  }
  else if (EV == ecvendor_systeme_helmholz) {
    local_18 = "Systeme Helmholz GmbH (Development)";
  }
  else if (EV == ecvendor_pantec) {
    local_18 = "Pantec Engineering AG";
  }
  else if (EV == ecvendor_abb_stotz_kontakt) {
    local_18 = "ABB STOTZ-KONTAKT GmbH (STO-CPD)";
  }
  else if (EV == ecvendor_berghof_automationstechnik) {
    local_18 = "Berghof Automationstechnik GmbH";
  }
  else if (EV == ecvendor_stotz_feinmesstechnik) {
    local_18 = "Stotz Feinmesstechnik GmbH";
  }
  else if (EV == ecvendor_dunkermotoren) {
    local_18 = "Dunkermotoren GmbH";
  }
  else if (EV == ecvendor_roche_diagnostics) {
    local_18 = "Roche Diagnostics AG";
  }
  else if (EV == ecvendor_toshiba_schneider) {
    local_18 = "Toshiba Schneider Inverter Corporation";
  }
  else if (EV == ecvendor_bihl_wiedemann) {
    local_18 = "Bihl-Wiedemann GmbH";
  }
  else if (EV == ecvendor_trinamic_motion_control) {
    local_18 = "TRINAMIC Motion Control GmbH & Co. KG";
  }
  else if (EV == ecvendor_performance_motion_devices) {
    local_18 = "Performance Motion Devices, Inc.";
  }
  else if (EV == ecvendor_ingenia_cat) {
    local_18 = "INGENIA-CAT, S.L.";
  }
  else if (EV == ecvendor_crevis) {
    local_18 = "CREVIS Co., Ltd.";
  }
  else if (EV == ecvendor_thk) {
    local_18 = "THK Co., Ltd.";
  }
  else if (EV == ecvendor_digitronic) {
    local_18 = "Digitronic Automationsanlagen GmbH";
  }
  else if (EV == ecvendor_hanyang) {
    local_18 = "HanYang System (Korea)";
  }
  else if (EV == ecvendor_baldor_uk) {
    local_18 = "Baldor UK Ltd";
  }
  else if (EV == ecvendor_beck_ipc) {
    local_18 = "Beck IPC GmbH";
  }
  else if (EV == ecvendor_etas) {
    local_18 = "ETAS GmbH";
  }
  else if (EV == ecvendor_phytec_messtechnik) {
    local_18 = "PHYTEC Messtechnik GmbH";
  }
  else if (EV == ecvendor_anca_motion) {
    local_18 = "ANCA Motion Pty. Ltd";
  }
  else if (EV == ecvendor_fh_koeln) {
    local_18 = "Fachhochschule Koeln (IME-RT)";
  }
  else if (EV == ecvendor_nuvation_research) {
    local_18 = "Nuvation Research Corporation";
  }
  else if (EV == ecvendor_tr) {
    local_18 = "TR-Electronic";
  }
  else if (EV == ecvendor_gantner) {
    local_18 = "Gantner Instruments GmbH";
  }
  else if (EV == ecvendor_mks_systems) {
    local_18 = "MKS Instruments (CIT Controls)";
  }
  else if (EV == ecvendor_abb_robotics) {
    local_18 = "ABB AB (Robotics)";
  }
  else if (EV == ecvendor_unitro_fleischmann) {
    local_18 = "Unitro-Fleischmann";
  }
  else if (EV == ecvendor_zub_machine_control) {
    local_18 = "zub machine control AG";
  }
  else if (EV == ecvendor_dspace) {
    local_18 = "dSPACE GmbH";
  }
  else if (EV == ecvendor_samsung) {
    local_18 = "Samsung Heavy Industries (Mechatronics Center)";
  }
  else if (EV == ecvendor_bce) {
    local_18 = "BCE Elektronik GmbH";
  }
  else if (EV == ecvendor_jaeger_messtechnik) {
    local_18 = "Jaeger Computergesteuerte Messtechnik GmbH";
  }
  else if (EV == ecvendor_tetra) {
    local_18 = "TETRA Gesellschaft fuer Sensorik, Robotik und Automation mbH";
  }
  else if (EV == ecvendor_justek) {
    local_18 = "Justek Inc. (Research Lab.)";
  }
  else if (EV == ecvendor_baumer_thalheim) {
    local_18 = "Baumer Thalheim GmbH & Co. KG";
  }
  else if (EV == ecvendor_elin_ebg_traction) {
    local_18 = "Elin EBG Traction GmbH";
  }
  else if (EV == ecvendor_meka_robotics) {
    local_18 = "Meka Robotics";
  }
  else if (EV == ecvendor_altera_japan) {
    local_18 = "Altera Japan Ltd.";
  }
  else if (EV == ecvendor_ebv_elektronik) {
    local_18 = "EBV Elektronik GmbH & Co. KG";
  }
  else if (EV == ecvendor_igh) {
    local_18 = "Ingenieurgemeinschaft IgH";
  }
  else if (EV == ecvendor_iav) {
    local_18 = "IAV GmbH (MD-E4)";
  }
  else if (EV == ecvendor_hitachi) {
    local_18 = "Hitachi Industrial Equipment Systems";
  }
  else if (EV == ecvendor_tenasys) {
    local_18 = "TenAsys Corp. (INtime)";
  }
  else if (EV == ecvendor_pondis) {
    local_18 = "PONDis AG";
  }
  else if (EV == ecvendor_moog_italiana) {
    local_18 = "Moog Italiana S.r.l. (Casella)";
  }
  else if (EV == ecvendor_wallner_automation) {
    local_18 = "Wallner Automation";
  }
  else if (EV == ecvendor_avl_list) {
    local_18 = "AVL List GmbH (PECE)";
  }
  else if (EV == ecvendor_ritter_elektronik) {
    local_18 = "RITTER-Elektronik GmbH";
  }
  else if (EV == ecvendor_zwick) {
    local_18 = "Zwick GmbH & Co. KG";
  }
  else if (EV == ecvendor_dresdenelektronik) {
    local_18 = "dresden elektronik ingenieurtechnik gmbh";
  }
  else if (EV == ecvendor_philips_healthcare) {
    local_18 = "Philips Healthcare (CT Division)";
  }
  else if (EV == ecvendor_chess) {
    local_18 = "Chess B.V.";
  }
  else if (EV == ecvendor_nct) {
    local_18 = "NCT kft";
  }
  else if (EV == ecvendor_anywire) {
    local_18 = "Anywire Corporation";
  }
  else if (EV == ecvendor_shadow_robot) {
    local_18 = "Shadow Robot Company Ltd.";
  }
  else if (EV == ecvendor_fecon) {
    local_18 = "FeCon GmbH";
  }
  else if (EV == ecvendor_fh_suedwestfahlen) {
    local_18 = "FH Suedwestfalen (LaborEV)";
  }
  else if (EV == ecvendor_add2) {
    local_18 = "add2 Ldt";
  }
  else if (EV == ecvendor_arm_automation) {
    local_18 = "ARM Automation, Inc.";
  }
  else if (EV == ecvendor_knapp_logistik) {
    local_18 = "KNAPP Logistik Automation GmbH (KNAPP AG)";
  }
  else if (EV == ecvendor_getriebebau_nord) {
    local_18 = "Getriebebau NORD GmbH & Co. KG";
  }
  else if (EV == ecvendor_yaskawa) {
    local_18 = "Yaskawa Electric Corporation (Japan)";
  }
  else if (EV == ecvendor_oki) {
    local_18 = "Oki Information Systems Co., Ltd. (Japan)";
  }
  else if (EV == ecvendor_takasaki_kyoudou) {
    local_18 = "Takasaki Kyoudou Computing Center Co. (Multimedia and Audio Visual)";
  }
  else if (EV == ecvendor_nittetsu_elex) {
    local_18 = "NITTETSU ELEX Co., Ltd. (FA-System)";
  }
  else if (EV == ecvendor_unjo) {
    local_18 = "Unjo AB";
  }
  else if (EV == ecvendor_eads_deutschland) {
    local_18 = "EADS Deutschland GmbH (Military Air Systems)";
  }
  else if (EV == ecvendor_acs_motion_control) {
    local_18 = "ACS Motion Control Ltd.";
  }
  else if (EV == ecvendor_keyence) {
    local_18 = "KEYENCE Corporation";
  }
  else if (EV == ecvendor_mefi) {
    local_18 = "MEFI s.r.o.";
  }
  else if (EV == ecvendor_mut) {
    local_18 = "m-u-t AG Messgeraete fuer Medizin- und Umwelttechnik";
  }
  else if (EV == ecvendor_isw_uni_stuttgart) {
    local_18 = "ISW - Universitaet Stuttgart (Fachbereich C)";
  }
  else if (EV == ecvendor_elsena) {
    local_18 = "ELSENA, Inc. (TOKYO)";
  }
  else if (EV == ecvendor_be_semiconductor) {
    local_18 = "BE Semiconductor Industries N.V. (Datacon Technology GmbH)";
  }
  else if (EV == ecvendor_hauni_lni) {
    local_18 = "Hauni LNI Electronics S.A. (R&D)";
  }
  else if (EV == ecvendor_etel) {
    local_18 = "ETEL S.A. (Electronics R&D)";
  }
  else if (EV == ecvendor_vat_vakuumventile) {
    local_18 = "VAT Vakuumventile AG";
  }
  else if (EV == ecvendor_laytec) {
    local_18 = "LayTec GmbH (Research&Development)";
  }
  else if (EV == ecvendor_num) {
    local_18 = "NUM AG";
  }
  else if (EV == ecvendor_hauni_maschinenbau) {
    local_18 = "Hauni Maschinenbau AG";
  }
  else if (EV == ecvendor_exatronic) {
    local_18 = "Exatronic, Engenharia Electronica, Lda";
  }
  else if (EV == ecvendor_iim_chinese_aos) {
    local_18 = "Institute of Intelligent Machines, Chinese Academy of Sciences";
  }
  else if (EV == ecvendor_tu_eindhoven) {
    local_18 = "Eindhoven University of Technology (Mechanical Engineering)";
  }
  else if (EV == ecvendor_scansonic) {
    local_18 = "Scansonic MI GmbH";
  }
  else if (EV == ecvendor_shanghai_sodick_sw) {
    local_18 = "Shanghai Sodick Software Co., Ltd.";
  }
  else if (EV == ecvendor_chuo_electronics) {
    local_18 = "CHUO ELECTRONICS CO., LTD";
  }
  else if (EV == ecvendor_agie) {
    local_18 = "AGIE SA";
  }
  else if (EV == ecvendor_hei_canton_de_vaud) {
    local_18 = 
    "Haute Ecoled\'Ingenierie et de Gestion du Canton de Vaud (IAI - Institut d\'Automatisation Industrielle de la HEIG-VD)"
    ;
  }
  else if (EV == ecvendor_jenny_science) {
    local_18 = "Jenny Science AG";
  }
  else if (EV == ecvendor_industrial_control_communications) {
    local_18 = "Industrial Control Communications, Inc.";
  }
  else if (EV == ecvendor_ckd_elektrotechnika) {
    local_18 = "CKD ELEKTROTECHNIKA, a.s. (Electrotechnics)";
  }
  else if (EV == ecvendor_qem) {
    local_18 = "QEM S.r.l.";
  }
  else if (EV == ecvendor_simatex) {
    local_18 = "Simatex AG (Software)";
  }
  else if (EV == ecvendor_kithara) {
    local_18 = "Kithara Software GmbH";
  }
  else if (EV == ecvendor_converteam) {
    local_18 = "Converteam GmbH";
  }
  else if (EV == ecvendor_ara) {
    local_18 = "Ara apparatenfabriek B.V.";
  }
  else if (EV == ecvendor_tata_consultancy) {
    local_18 = "Tata Consultancy Services Ltd. (Abhilash Embedded)";
  }
  else if (EV == ecvendor_tiab) {
    local_18 = "Tiab Limited";
  }
  else if (EV == ecvendor_rkc_instrument) {
    local_18 = "RKC INSTRUMENT INC.";
  }
  else if (EV == ecvendor_switched_reluctance) {
    local_18 = "Switched Reluctance Drives Ltd. (Development)";
  }
  else if (EV == ecvendor_avnet_electronics) {
    local_18 = "Avnet Electronics Marketing";
  }
  else if (EV == ecvendor_abb_force_measurement) {
    local_18 = "ABB AB (Force Measurement)";
  }
  else if (EV == ecvendor_kunbus) {
    local_18 = "KUNBUS GmbH";
  }
  else if (EV == ecvendor_acd_antriebstechnik) {
    local_18 = "ACD Antriebstechnik GmbH";
  }
  else if (EV == ecvendor_bronkhorst) {
    local_18 = "Bronkhorst High-Tech B.V.";
  }
  else if (EV == ecvendor_k_mecs) {
    local_18 = "K.MECS Co., Ltd. (Engineering Dept.)";
  }
  else if (EV == ecvendor_thomson_broadcast) {
    local_18 = "Thomson Broadcast & Multimedia AG";
  }
  else if (EV == ecvendor_ufg_elettronica) {
    local_18 = "UFG Elettronica s.r.l. (Manufacturing)";
  }
  else if (EV == ecvendor_xilinx) {
    local_18 = "Xilinx Ireland (Xilinx Design Services)";
  }
  else if (EV == ecvendor_abb_power_systems) {
    local_18 = "ABB AB (Power Systems)";
  }
  else if (EV == ecvendor_servoland) {
    local_18 = "Servoland Corporation";
  }
  else if (EV == ecvendor_hivertec) {
    local_18 = "Hivertec, Inc.";
  }
  else if (EV == ecvendor_fike_europe) {
    local_18 = "Fike Europe B.v.b.a.";
  }
  else if (EV == ecvendor_ropex) {
    local_18 = "ROPEX Industrie-Elektronik GmbH";
  }
  else if (EV == ecvendor_tlu) {
    local_18 = "TLU - Thueringer Leistungselektronik Union GmbH";
  }
  else if (EV == ecvendor_prodrive) {
    local_18 = "Prodrive B.V.";
  }
  else if (EV == ecvendor_miho_inspektionssysteme) {
    local_18 = "miho Inspektionssysteme GmbH";
  }
  else if (EV == ecvendor_tokyo_electron) {
    local_18 = "Tokyo Electron Device Limited (PLD)";
  }
  else if (EV == ecvendor_lintec) {
    local_18 = "LINTEC CO., LTD. (Design Division2)";
  }
  else if (EV == ecvendor_simplex_vision) {
    local_18 = "Symplex Vision Systems GmbH";
  }
  else if (EV == ecvendor_sus) {
    local_18 = "SUS Corporation";
  }
  else if (EV == ecvendor_trsystems) {
    local_18 = "TRsystems GmbH (Systembereich Unidor)";
  }
  else if (EV == ecvendor_harmonic_drive) {
    local_18 = "Harmonic Drive AG";
  }
  else if (EV == ecvendor_staeubli_faverges) {
    local_18 = "Staeubli Faverges SCA (Robotics)";
  }
  else if (EV == ecvendor_scienlab_electronic) {
    local_18 = "ScienLab electronic systems GmbH";
  }
  else if (EV == ecvendor_fujisoft) {
    local_18 = "FUJISOFT Incorporated (Atsugi Office)";
  }
  else if (EV == ecvendor_iai_corporation) {
    local_18 = "IAI Corporation";
  }
  else if (EV == ecvendor_promavtomatika) {
    local_18 = "PromAvtomatika";
  }
  else if (EV == ecvendor_kistler_instrumente) {
    local_18 = "Kistler Instrumente AG";
  }
  else if (EV == ecvendor_lauda_wobser) {
    local_18 = "LAUDA DR. R. WOBSER GmbH & Co. KG (Development / Construction)";
  }
  else if (EV == ecvendor_schweitzer_engineering_labs) {
    local_18 = "Schweitzer Engineering Laboratories, Inc.";
  }
  else if (EV == ecvendor_mutracx) {
    local_18 = "Mutracx B.V.";
  }
  else if (EV == ecvendor_algo) {
    local_18 = "Algo System Co., Ltd.";
  }
  else if (EV == ecvendor_muehlbauer) {
    local_18 = "Muehlbauer AG (Construction of special-purpose machines)";
  }
  else if (EV == ecvendor_sealevel_systems) {
    local_18 = "Sealevel Systems, Inc.";
  }
  else if (EV == ecvendor_igm_robotersysteme) {
    local_18 = "igm Robotersysteme AG";
  }
  else if (EV == ecvendor_zbe) {
    local_18 = "ZBE Inc.";
  }
  else if (EV == ecvendor_schneider_electric) {
    local_18 = "Schneider Electric Power Drives GmbH";
  }
  else if (EV == ecvendor_fraunhofer_iosb_ina) {
    local_18 = "Fraunhofer IOSB-INA Kompetenzzentrum Industrial Automation";
  }
  else if (EV == ecvendor_skf_magnetic_bearings) {
    local_18 = "SKF Magnetic Bearings";
  }
  else if (EV == ecevndor_galil_motion_control) {
    local_18 = "Galil Motion Control Inc.";
  }
  else if (EV == ecvendor_ihi) {
    local_18 = "IHI Corporation (Yokohama Engineering Center)";
  }
  else if (EV == ecvendor_wenglor_sensoric) {
    local_18 = "wenglor sensoric gmbh";
  }
  else if (EV == ecvendor_ingeteam) {
    local_18 = "Ingeteam Technology S.A.";
  }
  else if (EV == ecvendor_micro_vu) {
    local_18 = "Micro-Vu Corporation";
  }
  else if (EV == ecvendor_oehri_electronic) {
    local_18 = "oehri electronic ag";
  }
  else if (EV == ecvendor_nagano_oki) {
    local_18 = "Nagano Oki Electric Co., Ltd.";
  }
  else if (EV == ecvendor_condalo) {
    local_18 = "Condalo GmbH";
  }
  else if (EV == ecvendor_tg_drives) {
    local_18 = "TG Drives s.r.o.";
  }
  else if (EV == ecvendor_schleuniger) {
    local_18 = "Schleuniger AG";
  }
  else if (EV == ecvendor_renesas) {
    local_18 = "Renesas";
  }
  else if (EV == ecvendor_koenig) {
    local_18 = "Koenig Prozessautomatisierungs gmbH";
  }
  else if (EV == ecvendor_shanghai_cnc) {
    local_18 = "Shanghai Capital Numerical Control Co., Ltd. (Research and Developement)";
  }
  else if (EV == ecvendor_mitsubishi) {
    local_18 = "Mitsubishi Electric Corporation (Nagoya Works Marketing dept. Servo system section)"
    ;
  }
  else if (EV == ecvendor_john_deere) {
    local_18 = "John Deere Werke Mannheim";
  }
  else if (EV == ecvendor_cantops) {
    local_18 = "CanTops";
  }
  else if (EV == ecvendor_ids) {
    local_18 = "IDS GmbH (Germany)";
  }
  else if (EV == ecvendor_adlink) {
    local_18 = "ADLINK TECHNOLOGY INC.";
  }
  else if (EV == ecvendor_eubus) {
    local_18 = "eubus GmbH";
  }
  else if (EV == ecvendor_unico) {
    local_18 = "Unico Inc.";
  }
  else if (EV == ecvendor_dlr) {
    local_18 = 
    "DLR Deutsches Zentrum fuer Luft- und Raumfahrt e.V. (Institut fuer Robotik und Mechatronik)";
  }
  else if (EV == ecvendor_hei_canton_de_vaud_reds) {
    local_18 = "Haute Ecole d\'Ingenierie et de Gestion du Canton de Vaud du Canton de Vaud (REDS)";
  }
  else if (EV == ecvendor_bystorm) {
    local_18 = "BySTORM & CO. srl";
  }
  else if (EV == ecvendor_ipetronik) {
    local_18 = "IPETRONIK GmbH & Co. KG";
  }
  else if (EV == ecvendor_sennheiser) {
    local_18 = "Sennheiser electronic GmbH & Co. KG";
  }
  else if (EV == ecvendor_danieli_automation) {
    local_18 = "DANIELI AUTOMATION SPA (HiPAC Platform / Flat Products)";
  }
  else if (EV == ecvendor_acontis) {
    local_18 = "acontis technologies GmbH";
  }
  else if (EV == ecvendor_kuka) {
    local_18 = "KUKA Roboter GmbH (Purchasing)";
  }
  else if (EV == ecvendor_nat) {
    local_18 = "N.A.T. GmbH";
  }
  else if (EV == ecvendor_mecapion) {
    local_18 = "Mecapion Co., Ltd. (R&D Center)";
  }
  else if (EV == ecvendor_ontec) {
    local_18 = "ONTEC CO.,LTD (R&D Center)";
  }
  else if (EV == ecvendor_foxnum) {
    local_18 = "Foxnum Technology Co., Ltd. (Production Department)";
  }
  else if (EV == ecvendor_kyoei) {
    local_18 = "Kyoei Electronics Co., Ltd. (Systems Technical Sales Department)";
  }
  else if (EV == ecvendor_brother) {
    local_18 = "Brother Industries Ltd. (Machinery & Solution Company)";
  }
  else if (EV == ecvendor_shenyang_machine_tool) {
    local_18 = 
    "Shenyang Machine Tool (Group) Design Institute Co., Ltd. (Hardware Design Department)";
  }
  else if (EV == ecvendor_soft_servo) {
    local_18 = "Soft Servo Systems, Inc";
  }
  else if (EV == ecvendor_vipa) {
    local_18 = "VIPA GmbH";
  }
  else if (EV == ecvendor_gd) {
    local_18 = "G.D SpA (R&D GD3)";
  }
  else if (EV == ecvendor_keba_at) {
    local_18 = "KEBA AG (AT)";
  }
  else if (EV == ecvendor_willow_garage) {
    local_18 = "Willow Garage, Inc.";
  }
  else if (EV == ecvendor_interroll) {
    local_18 = "Interroll Trommelmotoren GmbH (Drummotor)";
  }
  else if (EV == ecvendor_silica_avnet) {
    local_18 = "Silica, Avnet EMG GmbH";
  }
  else if (EV == ecvendor_altima) {
    local_18 = "ALTIMA Corp.";
  }
  else if (EV == ecvendor_kuhnke) {
    local_18 = "Kuhnke Automation GmbH & Co. KG";
  }
  else if (EV == ecvendor_jat) {
    local_18 = "Jenaer Antriebstechnik GmbH";
  }
  else if (EV == ecvendor_heidelberger) {
    local_18 = "Heidelberger Druckmaschinen AG";
  }
  else if (EV == ecvendor_mecalc) {
    local_18 = "Mecalc PTY Limited";
  }
  else if (EV == ecvendor_samsung_sec) {
    local_18 = "Samsung Electronics Co. Ltd. (Mechatronics & Manufacturing Technology Center)";
  }
  else if (EV == ecvendor_aixcon) {
    local_18 = "aixcon PowerSystems GmbH";
  }
  else if (EV == ecvendor_kk_electronic) {
    local_18 = "KK-electronic a/s";
  }
  else if (EV == ecvendor_sick) {
    local_18 = "SICK AG (CD R&D)";
  }
  else if (EV == ecvendor_parker_hannifin) {
    local_18 = "Parker Hannifin SpA";
  }
  else if (EV == ecvendor_balluf) {
    local_18 = "Balluff GmbH (PC3)";
  }
  else if (EV == ecvendor_ma_vi) {
    local_18 = "Ma.Vi. srl";
  }
  else if (EV == ecvendor_kraeutner_software) {
    local_18 = "Kraeutner Software Solutions (Development)";
  }
  else if (EV == ecvendor_parker_hannifin_eme) {
    local_18 = "Parker Hannifin GmbH - EME (EMD Hauser)";
  }
  else if (EV == ecvendor_danfoss_drives) {
    local_18 = "Danfoss Drives A/S";
  }
  else if (EV == ecvendor_parker_hannifin_eme_630) {
    local_18 = "Parker Hannifin GmbH - EME (Automation Group-SSD Drives Europe 630)";
  }
  else if (EV == ecvendor_parker_hannifin_ssd) {
    local_18 = "Parker Hannifin Ltd. (SSD Drives)";
  }
  else if (EV == ecvendor_schneider_motion_control) {
    local_18 = "Schneider Electric Motion Deutschland GmbH & Co. KG";
  }
  else if (EV == ecvendor_fas) {
    local_18 = "FAS Technology Co., Ltd. (network)";
  }
  else if (EV == ecvendor_beckhoff_hardware) {
    local_18 = "Beckhoff Automation GmbH (Hardware Development)";
  }
  else if (EV == ecvendor_hengstler) {
    local_18 = "Hengstler GmbH (Germany)";
  }
  else if (EV == ecvendor_lenord_bauer) {
    local_18 = "Lenord Bauer & Co.GmbH";
  }
  else if (EV == ecvendor_ibv) {
    local_18 = "IBV - Echtzeit- und Embedded GmbH & Co. KG";
  }
  else if (EV == ecvendor_red_one) {
    local_18 = "Red one technologies (Institute of Robot research)";
  }
  else if (EV == ecvendor_shf_communication) {
    local_18 = "SHF Communication Technologies AG";
  }
  else if (EV == ecvendor_grossenbacher) {
    local_18 = "Grossenbacher Systeme AG";
  }
  else if (EV == ecvendor_nti_linmot) {
    local_18 = "NTI AG / LinMot (LinMot)";
  }
  else if (EV == ecvendor_eltromat) {
    local_18 = "Eltromat GmbH (Leopoldshoehe)";
  }
  else if (EV == ecvendor_arte_motion) {
    local_18 = "Arte Motion S.p.A.";
  }
  else if (EV == ecvendor_paul_maschinenfabrik) {
    local_18 = "PAUL Maschinenfabrik GmbH & Co.KG (Elektronik)";
  }
  else if ((EV & 0xe0000000) == 0xe0000000) {
    local_18 = SlaveVendorText(EV & 0x1fffffff);
  }
  else {
    local_18 = "----";
  }
  return local_18;
}

Assistant:

EC_T_CHAR* SlaveVendorText
    (T_eEtherCAT_Vendor EV)       /**< [in]   Vendor ID */
{
    EC_T_CHAR* pRet = EC_NULL;

    switch (EV)
    {
    VENDOR_TEXT(ecvendor_etg,                              "EtherCAT Technology Group");
    VENDOR_TEXT(ecvendor_beckhoff,                         "Beckhoff Automation GmbH");
#if !(defined EC_DEMO_TINY)
    VENDOR_TEXT(ecvendor_scuola_superiore_s_anna,          "Scuola Superiore S. Anna (PERCRO)");
    VENDOR_TEXT(ecvendor_ixxat,                            "IXXAT Automation GmbH");
    VENDOR_TEXT(ecvendor_vector_informatik,                "Vector Informatik GmbH");
    VENDOR_TEXT(ecvendor_knestel,                          "KNESTEL Technologie & Elektronik GmbH (Hardware/Product Development)");
    VENDOR_TEXT(ecvendor_cmz_sistemi,                      "CMZ Sistemi Elettronici");
    VENDOR_TEXT(ecvendor_softing,                          "Softing AG");
    VENDOR_TEXT(ecvendor_microcontrol,                     "MicroControl GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_pollmeier,                        "ESR Pollmeier");
    VENDOR_TEXT(ecvendor_lust,                             "LTI Lust");
    VENDOR_TEXT(ecvendor_kuebler,                          "Fritz Kuebler GmbH");
    VENDOR_TEXT(ecvendor_keb,                              "KEB, Karl E. Brinkmann GmbH");
    VENDOR_TEXT(ecvendor_lti,                              "LTi DRiVES GmbH");
    VENDOR_TEXT(ecvendor_esd_electronic_design,            "esd electronic system design gmbh");
    VENDOR_TEXT(ecvendor_hms_industrial_networks,          "HMS Industrial Networks AB");
    VENDOR_TEXT(ecvendor_epis_automation,                  "epis Automation GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_festo,                            "Festo AG & Co, KG (TV-N)");
    VENDOR_TEXT(ecvendor_wago,                             "WAGO Kontakttechnik GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_boschrexroth,                     "Bosch Rexroth AG");
    VENDOR_TEXT(ecvendor_moog,                             "Moog GmbH");
    VENDOR_TEXT(ecvendor_port,                             "port GmbH");
    VENDOR_TEXT(ecvendor_buerkert_werke,                   "Buerkert Werke GmbH & Co. KG (Development)");
    VENDOR_TEXT(ecvendor_lenze,                            "Lenze Drive Systems GmbH (Lenze AG)");
    VENDOR_TEXT(ecvendor_tigris_electronic,                "Tigris Electronic GmbH");
    VENDOR_TEXT(ecvendor_hilscher,                         "Hilscher GmbH");
    VENDOR_TEXT(ecvendor_murrelektronik,                   "Murrelektronik GmbH");
    VENDOR_TEXT(ecvendor_bombardier_transportation,        "Bombardier Transportation (Power Converter Solutions) Germany GmbH (PCS Germany)");
    VENDOR_TEXT(ecvendor_komax,                            "Komax AG");
    VENDOR_TEXT(ecvendor_sew_eurodrive,                    "SEW-EURODRIVE GmbH & Co. (EETB)");
    VENDOR_TEXT(ecvendor_bachmann_electronic,              "Bachmann electronic GmbH");
    VENDOR_TEXT(ecvendor_danaher,                          "Danaher Motion GmbH");
    VENDOR_TEXT(ecvendor_kollmorgen,                       "Kollmorgen Corporation");
    VENDOR_TEXT(ecvendor_woodward_seg,                     "Woodward SEG GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_bernecker_rainer_ie,              "Bernecker + Rainer Industrie-Elektronik Ges.m.b.H");
    VENDOR_TEXT(ecvendor_infranor_electronics,             "Infranor Electronics Sas");
    VENDOR_TEXT(ecvendor_omron,                            "OMRON Corporation");
    VENDOR_TEXT(ecvendor_gefran,                           "Gefran S.P.A.");
    VENDOR_TEXT(ecvendor_elmo_motion,                      "Elmo Motion Control Ltd.");
    VENDOR_TEXT(ecvendor_sontheim_industrie_elektronik,    "Sontheim Industrie Elektronik GmbH");
    VENDOR_TEXT(ecvendor_hirschmann_automation,            "Hirschmann Automation and Control GmbH (INET)");
    VENDOR_TEXT(ecvendor_copley,                           "Copley Controls, a Division of Analogic Corporation");
    VENDOR_TEXT(ecvendor_pepperl_fuchs,                    "Pepperl+Fuchs GmbH");
    VENDOR_TEXT(ecvendor_johannes_huebner,                 "Johannes Huebner Fabrik elektrischer Maschinen GmbH");
    VENDOR_TEXT(ecvendor_abb_oy_drives,                    "ABB Oy Drives");
    VENDOR_TEXT(ecvendor_stoeber,                          "Stoeber Antriebstechnik GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_messung_systems,                  "MESSUNG SYSTEMS");
    VENDOR_TEXT(ecvendor_bonfiglioli_vectron,              "BONFIGLIOLI VECTRON GmbH");
    VENDOR_TEXT(ecvendor_phase_motion_control,             "Phase Motion Control SpA");
    VENDOR_TEXT(ecvendor_metronix,                         "Metronix Messgeraete und Elektronik GmbH");
    VENDOR_TEXT(ecvendor_ascon,                            "Ascon S.p.A. (R&D)");
    VENDOR_TEXT(ecvendor_controltechniques,                "Control Techniques");
    VENDOR_TEXT(ecvendor_maxon_motor,                      "Maxon motor");
    VENDOR_TEXT(ecvendor_keba,                             "KEBA AG (Product Development - Control)");
    VENDOR_TEXT(ecvendor_wittenstein,                      "WITTENSTEIN motion control GmbH");
    VENDOR_TEXT(ecvendor_twk_elektronik,                   "TWK-Elektronik GmbH");
    VENDOR_TEXT(ecvendor_psa_elettronica,                  "PSA Elettronica di F. Grifa");
    VENDOR_TEXT(ecvendor_smc,                              "SMC Corporation");
    VENDOR_TEXT(ecvendor_jvl_industri_elektronik,          "JVL Industri Elektronik A/S");
    VENDOR_TEXT(ecvendor_hottinger_baldwin,                "Hottinger Baldwin Messtechnik GmbH");
    VENDOR_TEXT(ecvendor_leuze_electronic,                 "Leuze electronic GmbH + Co. KG");
    VENDOR_TEXT(ecvendor_jumo,                             "Juchheim Fulda");
    VENDOR_TEXT(ecvendor_hsd,                              "HSD S.p.A");
    VENDOR_TEXT(ecvendor_lika_electronic,                  "Lika Electronic SncCSM GmbH");
    VENDOR_TEXT(ecvendor_csm,                              "CSM GmbH");
    VENDOR_TEXT(ecvendor_lpkf_motion_control,              "LPKF Motion & Control GmbH");
    VENDOR_TEXT(ecvendor_imc_messysteme,                   "imc Messysteme GmbH");
    VENDOR_TEXT(ecvendor_baumueller,                       "Baumueller Nuernberg GmbH");
    VENDOR_TEXT(ecvendor_pneumax,                          "Pneumax S.p.A.");
    VENDOR_TEXT(ecvendor_promess,                          "Promess Incorporated");
    VENDOR_TEXT(ecvendor_deutschmann,                      "Deutschmann Automation GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_golden,                           "Golden A/S (Research And Development)");
    VENDOR_TEXT(ecvendor_brunner_elektronik,               "Brunner Elektronik AG");
    VENDOR_TEXT(ecvendor_technosoft,                       "TECHNOSOFT S.A.");
    VENDOR_TEXT(ecvendor_peyer_engineering,                "Peyer Engineering");
    VENDOR_TEXT(ecvendor_robox,                            "Robox S.P.A.");
    VENDOR_TEXT(ecvendor_parker,                           "Parker?");
    VENDOR_TEXT(ecvendor_sanyo_denki,                      "Sanyo Denki Co., Ltd. (2nd Design Dept. Servo System Div.)");
    VENDOR_TEXT(ecvendor_delta_electronics,                "Delta Electronics, Inc.");
    VENDOR_TEXT(ecvendor_amk,                              "AMK GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_national_instruments,             "National Instruments (PortableDAQ)");
    VENDOR_TEXT(ecvendor_fernsteuergeraete_kurt_oelsch,    "Fernsteuergeraete Kurt Oelsch GmbH");
    VENDOR_TEXT(ecvendor_idam,                             "INA - Drives & Mechatronics GmbH & Co.oHG (Research & Development)");
    VENDOR_TEXT(ecvendor_prueftechnik_ndt,                 "PRUEFTECHNIK NDT GmbH");
    VENDOR_TEXT(ecvendor_baumer_th,                        "Baumer Thalheim?");
    VENDOR_TEXT(ecvendor_esitron_electronic,               "esitron-electronic GmbH");
    VENDOR_TEXT(ecvendor_systeme_helmholz,                 "Systeme Helmholz GmbH (Development)");
    VENDOR_TEXT(ecvendor_pantec,                           "Pantec Engineering AG");
    VENDOR_TEXT(ecvendor_abb_stotz_kontakt,                "ABB STOTZ-KONTAKT GmbH (STO-CPD)");
    VENDOR_TEXT(ecvendor_berghof_automationstechnik,       "Berghof Automationstechnik GmbH");
    VENDOR_TEXT(ecvendor_stotz_feinmesstechnik,            "Stotz Feinmesstechnik GmbH");
    VENDOR_TEXT(ecvendor_dunkermotoren,                    "Dunkermotoren GmbH");
    VENDOR_TEXT(ecvendor_roche_diagnostics,                "Roche Diagnostics AG");
    VENDOR_TEXT(ecvendor_toshiba_schneider,                "Toshiba Schneider Inverter Corporation");
    VENDOR_TEXT(ecvendor_bihl_wiedemann,                   "Bihl-Wiedemann GmbH");
    VENDOR_TEXT(ecvendor_trinamic_motion_control,          "TRINAMIC Motion Control GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_performance_motion_devices,       "Performance Motion Devices, Inc.");
    VENDOR_TEXT(ecvendor_ingenia_cat,                      "INGENIA-CAT, S.L.");
    VENDOR_TEXT(ecvendor_crevis,                           "CREVIS Co., Ltd.");
    VENDOR_TEXT(ecvendor_thk,                              "THK Co., Ltd.");
    VENDOR_TEXT(ecvendor_digitronic,                       "Digitronic Automationsanlagen GmbH");
    VENDOR_TEXT(ecvendor_hanyang,                          "HanYang System (Korea)");
    VENDOR_TEXT(ecvendor_baldor_uk,                        "Baldor UK Ltd");
    VENDOR_TEXT(ecvendor_beck_ipc,                         "Beck IPC GmbH");
    VENDOR_TEXT(ecvendor_etas,                             "ETAS GmbH");
    VENDOR_TEXT(ecvendor_phytec_messtechnik,               "PHYTEC Messtechnik GmbH");
    VENDOR_TEXT(ecvendor_anca_motion,                      "ANCA Motion Pty. Ltd");
    VENDOR_TEXT(ecvendor_fh_koeln,                         "Fachhochschule Koeln (IME-RT)");
    VENDOR_TEXT(ecvendor_nuvation_research,                "Nuvation Research Corporation");
    VENDOR_TEXT(ecvendor_tr,                               "TR-Electronic");
    VENDOR_TEXT(ecvendor_gantner,                          "Gantner Instruments GmbH");
    VENDOR_TEXT(ecvendor_mks_systems,                      "MKS Instruments (CIT Controls)");
    VENDOR_TEXT(ecvendor_abb_robotics,                     "ABB AB (Robotics)");
    VENDOR_TEXT(ecvendor_unitro_fleischmann,               "Unitro-Fleischmann");
    VENDOR_TEXT(ecvendor_zub_machine_control,              "zub machine control AG");
    VENDOR_TEXT(ecvendor_dspace,                           "dSPACE GmbH");
    VENDOR_TEXT(ecvendor_samsung,                          "Samsung Heavy Industries (Mechatronics Center)");
    VENDOR_TEXT(ecvendor_bce,                              "BCE Elektronik GmbH");
    VENDOR_TEXT(ecvendor_jaeger_messtechnik,               "Jaeger Computergesteuerte Messtechnik GmbH");
    VENDOR_TEXT(ecvendor_tetra,                            "TETRA Gesellschaft fuer Sensorik, Robotik und Automation mbH");
    VENDOR_TEXT(ecvendor_justek,                           "Justek Inc. (Research Lab.)");
    VENDOR_TEXT(ecvendor_baumer_thalheim,                  "Baumer Thalheim GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_elin_ebg_traction,                "Elin EBG Traction GmbH");
    VENDOR_TEXT(ecvendor_meka_robotics,                    "Meka Robotics");
    VENDOR_TEXT(ecvendor_altera_japan,                     "Altera Japan Ltd.");
    VENDOR_TEXT(ecvendor_ebv_elektronik,                   "EBV Elektronik GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_igh,                              "Ingenieurgemeinschaft IgH");
    VENDOR_TEXT(ecvendor_iav,                              "IAV GmbH (MD-E4)");
    VENDOR_TEXT(ecvendor_hitachi,                          "Hitachi Industrial Equipment Systems");
    VENDOR_TEXT(ecvendor_tenasys,                          "TenAsys Corp. (INtime)");
    VENDOR_TEXT(ecvendor_pondis,                           "PONDis AG");
    VENDOR_TEXT(ecvendor_moog_italiana,                    "Moog Italiana S.r.l. (Casella)");
    VENDOR_TEXT(ecvendor_wallner_automation,               "Wallner Automation");
    VENDOR_TEXT(ecvendor_avl_list,                         "AVL List GmbH (PECE)");
    VENDOR_TEXT(ecvendor_ritter_elektronik,                "RITTER-Elektronik GmbH");
    VENDOR_TEXT(ecvendor_zwick,                            "Zwick GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_dresdenelektronik,                "dresden elektronik ingenieurtechnik gmbh");
    VENDOR_TEXT(ecvendor_philips_healthcare,               "Philips Healthcare (CT Division)");
    VENDOR_TEXT(ecvendor_chess,                            "Chess B.V.");
    VENDOR_TEXT(ecvendor_nct,                              "NCT kft");
    VENDOR_TEXT(ecvendor_anywire,                          "Anywire Corporation");
    VENDOR_TEXT(ecvendor_shadow_robot,                     "Shadow Robot Company Ltd.");
    VENDOR_TEXT(ecvendor_fecon,                            "FeCon GmbH");
    VENDOR_TEXT(ecvendor_fh_suedwestfahlen,                "FH Suedwestfalen (LaborEV)");
    VENDOR_TEXT(ecvendor_add2,                             "add2 Ldt");
    VENDOR_TEXT(ecvendor_arm_automation,                   "ARM Automation, Inc.");
    VENDOR_TEXT(ecvendor_knapp_logistik,                   "KNAPP Logistik Automation GmbH (KNAPP AG)");
    VENDOR_TEXT(ecvendor_getriebebau_nord,                 "Getriebebau NORD GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_yaskawa,                          "Yaskawa Electric Corporation (Japan)");
    VENDOR_TEXT(ecvendor_oki,                              "Oki Information Systems Co., Ltd. (Japan)");
    VENDOR_TEXT(ecvendor_takasaki_kyoudou,                 "Takasaki Kyoudou Computing Center Co. (Multimedia and Audio Visual)");
    VENDOR_TEXT(ecvendor_nittetsu_elex,                    "NITTETSU ELEX Co., Ltd. (FA-System)");
    VENDOR_TEXT(ecvendor_unjo,                             "Unjo AB");
    VENDOR_TEXT(ecvendor_eads_deutschland,                 "EADS Deutschland GmbH (Military Air Systems)");
    VENDOR_TEXT(ecvendor_acs_motion_control,               "ACS Motion Control Ltd.");
    VENDOR_TEXT(ecvendor_keyence,                          "KEYENCE Corporation");
    VENDOR_TEXT(ecvendor_mefi,                             "MEFI s.r.o.");
    VENDOR_TEXT(ecvendor_mut,                              "m-u-t AG Messgeraete fuer Medizin- und Umwelttechnik");
    VENDOR_TEXT(ecvendor_isw_uni_stuttgart,                "ISW - Universitaet Stuttgart (Fachbereich C)");
    VENDOR_TEXT(ecvendor_elsena,                           "ELSENA, Inc. (TOKYO)");
    VENDOR_TEXT(ecvendor_be_semiconductor,                 "BE Semiconductor Industries N.V. (Datacon Technology GmbH)");
    VENDOR_TEXT(ecvendor_hauni_lni,                        "Hauni LNI Electronics S.A. (R&D)");
    VENDOR_TEXT(ecvendor_etel,                             "ETEL S.A. (Electronics R&D)");
    VENDOR_TEXT(ecvendor_vat_vakuumventile,                "VAT Vakuumventile AG");
    VENDOR_TEXT(ecvendor_laytec,                           "LayTec GmbH (Research&Development)");
    VENDOR_TEXT(ecvendor_num,                              "NUM AG");
    VENDOR_TEXT(ecvendor_hauni_maschinenbau,               "Hauni Maschinenbau AG");
    VENDOR_TEXT(ecvendor_exatronic,                        "Exatronic, Engenharia Electronica, Lda");
    VENDOR_TEXT(ecvendor_iim_chinese_aos,                  "Institute of Intelligent Machines, Chinese Academy of Sciences");
    VENDOR_TEXT(ecvendor_tu_eindhoven,                     "Eindhoven University of Technology (Mechanical Engineering)");
    VENDOR_TEXT(ecvendor_scansonic,                        "Scansonic MI GmbH");
    VENDOR_TEXT(ecvendor_shanghai_sodick_sw,               "Shanghai Sodick Software Co., Ltd.");
    VENDOR_TEXT(ecvendor_chuo_electronics,                 "CHUO ELECTRONICS CO., LTD");
    VENDOR_TEXT(ecvendor_agie,                             "AGIE SA");
    VENDOR_TEXT(ecvendor_hei_canton_de_vaud,               "Haute Ecoled'Ingenierie et de Gestion du Canton de Vaud (IAI - Institut d'Automatisation Industrielle de la HEIG-VD)");
    VENDOR_TEXT(ecvendor_jenny_science,                    "Jenny Science AG");
    VENDOR_TEXT(ecvendor_industrial_control_communications,"Industrial Control Communications, Inc.");
    VENDOR_TEXT(ecvendor_ckd_elektrotechnika,              "CKD ELEKTROTECHNIKA, a.s. (Electrotechnics)");
    VENDOR_TEXT(ecvendor_qem,                              "QEM S.r.l.");
    VENDOR_TEXT(ecvendor_simatex,                          "Simatex AG (Software)");
    VENDOR_TEXT(ecvendor_kithara,                          "Kithara Software GmbH");
    VENDOR_TEXT(ecvendor_converteam,                       "Converteam GmbH");
    VENDOR_TEXT(ecvendor_ara,                              "Ara apparatenfabriek B.V.");
    VENDOR_TEXT(ecvendor_tata_consultancy,                 "Tata Consultancy Services Ltd. (Abhilash Embedded)");
    VENDOR_TEXT(ecvendor_tiab,                             "Tiab Limited");
    VENDOR_TEXT(ecvendor_rkc_instrument,                   "RKC INSTRUMENT INC.");
    VENDOR_TEXT(ecvendor_switched_reluctance,              "Switched Reluctance Drives Ltd. (Development)");
    VENDOR_TEXT(ecvendor_avnet_electronics,                "Avnet Electronics Marketing");
    VENDOR_TEXT(ecvendor_abb_force_measurement,            "ABB AB (Force Measurement)");
    VENDOR_TEXT(ecvendor_kunbus,                           "KUNBUS GmbH");
    VENDOR_TEXT(ecvendor_acd_antriebstechnik,              "ACD Antriebstechnik GmbH");
    VENDOR_TEXT(ecvendor_bronkhorst,                       "Bronkhorst High-Tech B.V.");
    VENDOR_TEXT(ecvendor_k_mecs,                           "K.MECS Co., Ltd. (Engineering Dept.)");
    VENDOR_TEXT(ecvendor_thomson_broadcast,                "Thomson Broadcast & Multimedia AG");
    VENDOR_TEXT(ecvendor_ufg_elettronica,                  "UFG Elettronica s.r.l. (Manufacturing)");
    VENDOR_TEXT(ecvendor_xilinx,                           "Xilinx Ireland (Xilinx Design Services)");
    VENDOR_TEXT(ecvendor_abb_power_systems,                "ABB AB (Power Systems)");
    VENDOR_TEXT(ecvendor_servoland,                        "Servoland Corporation");
    VENDOR_TEXT(ecvendor_hivertec,                         "Hivertec, Inc.");
    VENDOR_TEXT(ecvendor_fike_europe,                      "Fike Europe B.v.b.a.");
    VENDOR_TEXT(ecvendor_ropex,                            "ROPEX Industrie-Elektronik GmbH");
    VENDOR_TEXT(ecvendor_tlu,                              "TLU - Thueringer Leistungselektronik Union GmbH");
    VENDOR_TEXT(ecvendor_prodrive,                         "Prodrive B.V.");
    VENDOR_TEXT(ecvendor_miho_inspektionssysteme,          "miho Inspektionssysteme GmbH");
    VENDOR_TEXT(ecvendor_tokyo_electron,                   "Tokyo Electron Device Limited (PLD)");
    VENDOR_TEXT(ecvendor_lintec,                           "LINTEC CO., LTD. (Design Division2)");
    VENDOR_TEXT(ecvendor_simplex_vision,                   "Symplex Vision Systems GmbH");
    VENDOR_TEXT(ecvendor_sus,                              "SUS Corporation");
    VENDOR_TEXT(ecvendor_trsystems,                        "TRsystems GmbH (Systembereich Unidor)");
    VENDOR_TEXT(ecvendor_harmonic_drive,                   "Harmonic Drive AG");
    VENDOR_TEXT(ecvendor_staeubli_faverges,                "Staeubli Faverges SCA (Robotics)");
    VENDOR_TEXT(ecvendor_scienlab_electronic,              "ScienLab electronic systems GmbH");
    VENDOR_TEXT(ecvendor_fujisoft,                         "FUJISOFT Incorporated (Atsugi Office)");
    VENDOR_TEXT(ecvendor_iai_corporation,                  "IAI Corporation");
    VENDOR_TEXT(ecvendor_promavtomatika,                   "PromAvtomatika");
    VENDOR_TEXT(ecvendor_kistler_instrumente,              "Kistler Instrumente AG");
    VENDOR_TEXT(ecvendor_lauda_wobser,                     "LAUDA DR. R. WOBSER GmbH & Co. KG (Development / Construction)");
    VENDOR_TEXT(ecvendor_schweitzer_engineering_labs,      "Schweitzer Engineering Laboratories, Inc.");
    VENDOR_TEXT(ecvendor_mutracx,                          "Mutracx B.V.");
    VENDOR_TEXT(ecvendor_algo,                             "Algo System Co., Ltd.");
    VENDOR_TEXT(ecvendor_muehlbauer,                       "Muehlbauer AG (Construction of special-purpose machines)");
    VENDOR_TEXT(ecvendor_sealevel_systems,                 "Sealevel Systems, Inc.");
    VENDOR_TEXT(ecvendor_igm_robotersysteme,               "igm Robotersysteme AG");
    VENDOR_TEXT(ecvendor_zbe,                              "ZBE Inc.");
    VENDOR_TEXT(ecvendor_schneider_electric,               "Schneider Electric Power Drives GmbH");
    VENDOR_TEXT(ecvendor_fraunhofer_iosb_ina,              "Fraunhofer IOSB-INA Kompetenzzentrum Industrial Automation");
    VENDOR_TEXT(ecvendor_skf_magnetic_bearings,            "SKF Magnetic Bearings");
    VENDOR_TEXT(ecevndor_galil_motion_control,             "Galil Motion Control Inc.");
    VENDOR_TEXT(ecvendor_ihi,                              "IHI Corporation (Yokohama Engineering Center)");
    VENDOR_TEXT(ecvendor_wenglor_sensoric,                 "wenglor sensoric gmbh");
    VENDOR_TEXT(ecvendor_ingeteam,                         "Ingeteam Technology S.A.");
    VENDOR_TEXT(ecvendor_micro_vu,                         "Micro-Vu Corporation");
    VENDOR_TEXT(ecvendor_oehri_electronic,                 "oehri electronic ag");
    VENDOR_TEXT(ecvendor_nagano_oki,                       "Nagano Oki Electric Co., Ltd.");
    VENDOR_TEXT(ecvendor_condalo,                          "Condalo GmbH");
    VENDOR_TEXT(ecvendor_tg_drives,                        "TG Drives s.r.o.");
    VENDOR_TEXT(ecvendor_schleuniger,                      "Schleuniger AG");
    VENDOR_TEXT(ecvendor_renesas,                          "Renesas");
    VENDOR_TEXT(ecvendor_koenig,                           "Koenig Prozessautomatisierungs gmbH");
    VENDOR_TEXT(ecvendor_shanghai_cnc,                     "Shanghai Capital Numerical Control Co., Ltd. (Research and Developement)");
    VENDOR_TEXT(ecvendor_mitsubishi,                       "Mitsubishi Electric Corporation (Nagoya Works Marketing dept. Servo system section)");
    VENDOR_TEXT(ecvendor_john_deere,                       "John Deere Werke Mannheim");
    VENDOR_TEXT(ecvendor_cantops,                          "CanTops");
    VENDOR_TEXT(ecvendor_ids,                              "IDS GmbH (Germany)");
    VENDOR_TEXT(ecvendor_adlink,                           "ADLINK TECHNOLOGY INC.");
    VENDOR_TEXT(ecvendor_eubus,                            "eubus GmbH");
    VENDOR_TEXT(ecvendor_unico,                            "Unico Inc.");
    VENDOR_TEXT(ecvendor_dlr,                              "DLR Deutsches Zentrum fuer Luft- und Raumfahrt e.V. (Institut fuer Robotik und Mechatronik)");
    VENDOR_TEXT(ecvendor_hei_canton_de_vaud_reds,          "Haute Ecole d'Ingenierie et de Gestion du Canton de Vaud du Canton de Vaud (REDS)");
    VENDOR_TEXT(ecvendor_bystorm,                          "BySTORM & CO. srl");
    VENDOR_TEXT(ecvendor_ipetronik,                        "IPETRONIK GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_sennheiser,                       "Sennheiser electronic GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_danieli_automation,               "DANIELI AUTOMATION SPA (HiPAC Platform / Flat Products)");
    VENDOR_TEXT(ecvendor_acontis,                          "acontis technologies GmbH");
    VENDOR_TEXT(ecvendor_kuka,                             "KUKA Roboter GmbH (Purchasing)");
    VENDOR_TEXT(ecvendor_nat,                              "N.A.T. GmbH");
    VENDOR_TEXT(ecvendor_mecapion,                         "Mecapion Co., Ltd. (R&D Center)");
    VENDOR_TEXT(ecvendor_ontec,                            "ONTEC CO.,LTD (R&D Center)");
    VENDOR_TEXT(ecvendor_foxnum,                           "Foxnum Technology Co., Ltd. (Production Department)");
    VENDOR_TEXT(ecvendor_kyoei,                            "Kyoei Electronics Co., Ltd. (Systems Technical Sales Department)");
    VENDOR_TEXT(ecvendor_brother,                          "Brother Industries Ltd. (Machinery & Solution Company)");
    VENDOR_TEXT(ecvendor_shenyang_machine_tool,            "Shenyang Machine Tool (Group) Design Institute Co., Ltd. (Hardware Design Department)");
    VENDOR_TEXT(ecvendor_soft_servo,                       "Soft Servo Systems, Inc");
    VENDOR_TEXT(ecvendor_vipa,                             "VIPA GmbH");
    VENDOR_TEXT(ecvendor_gd,                               "G.D SpA (R&D GD3)");
    VENDOR_TEXT(ecvendor_keba_at,                          "KEBA AG (AT)");
    VENDOR_TEXT(ecvendor_willow_garage,                    "Willow Garage, Inc.");
    VENDOR_TEXT(ecvendor_interroll,                        "Interroll Trommelmotoren GmbH (Drummotor)");
    VENDOR_TEXT(ecvendor_silica_avnet,                     "Silica, Avnet EMG GmbH");
    VENDOR_TEXT(ecvendor_altima,                           "ALTIMA Corp.");
    VENDOR_TEXT(ecvendor_kuhnke,                           "Kuhnke Automation GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_jat,                              "Jenaer Antriebstechnik GmbH");
    VENDOR_TEXT(ecvendor_heidelberger,                     "Heidelberger Druckmaschinen AG");
    VENDOR_TEXT(ecvendor_mecalc,                           "Mecalc PTY Limited");
    VENDOR_TEXT(ecvendor_samsung_sec,                      "Samsung Electronics Co. Ltd. (Mechatronics & Manufacturing Technology Center)");
    VENDOR_TEXT(ecvendor_aixcon,                           "aixcon PowerSystems GmbH");
    VENDOR_TEXT(ecvendor_kk_electronic,                    "KK-electronic a/s");
    VENDOR_TEXT(ecvendor_sick,                             "SICK AG (CD R&D)");
    VENDOR_TEXT(ecvendor_parker_hannifin,                  "Parker Hannifin SpA");
    VENDOR_TEXT(ecvendor_balluf,                           "Balluff GmbH (PC3)");
    VENDOR_TEXT(ecvendor_ma_vi,                            "Ma.Vi. srl");
    VENDOR_TEXT(ecvendor_kraeutner_software,               "Kraeutner Software Solutions (Development)");
    VENDOR_TEXT(ecvendor_parker_hannifin_eme,              "Parker Hannifin GmbH - EME (EMD Hauser)");
    VENDOR_TEXT(ecvendor_danfoss_drives,                   "Danfoss Drives A/S");
    VENDOR_TEXT(ecvendor_parker_hannifin_eme_630,          "Parker Hannifin GmbH - EME (Automation Group-SSD Drives Europe 630)");
    VENDOR_TEXT(ecvendor_parker_hannifin_ssd,              "Parker Hannifin Ltd. (SSD Drives)");
    VENDOR_TEXT(ecvendor_schneider_motion_control,         "Schneider Electric Motion Deutschland GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_fas,                              "FAS Technology Co., Ltd. (network)");
    VENDOR_TEXT(ecvendor_beckhoff_hardware,                "Beckhoff Automation GmbH (Hardware Development)");
    VENDOR_TEXT(ecvendor_hengstler,                        "Hengstler GmbH (Germany)");
    VENDOR_TEXT(ecvendor_lenord_bauer,                     "Lenord Bauer & Co.GmbH");
    VENDOR_TEXT(ecvendor_ibv,                              "IBV - Echtzeit- und Embedded GmbH & Co. KG");
    VENDOR_TEXT(ecvendor_red_one,                          "Red one technologies (Institute of Robot research)");
    VENDOR_TEXT(ecvendor_shf_communication,                "SHF Communication Technologies AG");
    VENDOR_TEXT(ecvendor_grossenbacher,                    "Grossenbacher Systeme AG");
    VENDOR_TEXT(ecvendor_nti_linmot,                       "NTI AG / LinMot (LinMot)");
    VENDOR_TEXT(ecvendor_eltromat,                         "Eltromat GmbH (Leopoldshoehe)");
    VENDOR_TEXT(ecvendor_arte_motion,                      "Arte Motion S.p.A.");
    VENDOR_TEXT(ecvendor_paul_maschinenfabrik,             "PAUL Maschinenfabrik GmbH & Co.KG (Elektronik)");
    VENDOR_TEXT(ecvendor_handtmann,                        "Albert Handtmann Maschinenfabrik GmbH & Co. KG");
#endif /*#if !(defined EC_DEMO_TINY)*/
    default:
        if (0xE0000000 == (((EC_T_DWORD)EV)&0xE0000000))
        {
            pRet = SlaveVendorText((T_eEtherCAT_Vendor)(((EC_T_DWORD)EV)&(~0xE0000000)));
        }
        else
        {
            pRet = (EC_T_CHAR*)"----";
        }
    }

    return pRet;
}